

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::UncoreMinimize::handleModel(UncoreMinimize *this,Solver *s)

{
  int iVar1;
  uint uVar2;
  SharedData *pSVar3;
  long *newOpt;
  
  iVar1 = (*(this->super_MinimizeConstraint).super_Constraint._vptr_Constraint[6])();
  if (SUB41(iVar1,0) != false) {
    newOpt = this->sum_;
    if (*newOpt < 0) {
      computeSum(this,s);
      newOpt = this->sum_;
    }
    SharedMinimizeData::setOptimum((this->super_MinimizeConstraint).shared_,newOpt);
    pSVar3 = (this->super_MinimizeConstraint).shared_;
    uVar2 = 0;
    if (pSVar3->mode_ != enumerate) {
      uVar2 = (uint)((pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar3->optGen_) <<
              0x1c;
      pSVar3 = (this->super_MinimizeConstraint).shared_;
    }
    *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xefffffff | uVar2;
    this->gen_ = (pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i;
    pSVar3 = (this->super_MinimizeConstraint).shared_;
    this->upper_ = *(wsum_t *)
                    (*(long *)((long)&pSVar3->up_[0].ebo_.buf +
                              (ulong)(((pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i & 1)
                                     << 4)) + (ulong)(*(uint *)&this->field_0xec & 0xfffffff) * 8);
    if ((((*(uint *)&this->field_0xec & 0x30000000) == 0x10000000) &&
        (this->nextW_ == 0 && (this->todo_).next_ == 0)) &&
       (this->lower_ != this->sum_[*(uint *)&this->field_0xec & 0xfffffff])) {
      Potassco::fail(-1,"virtual bool Clasp::UncoreMinimize::handleModel(Solver &)",0x43e,
                     "!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_]",
                     "Unexpected lower bound on model!",0);
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool UncoreMinimize::handleModel(Solver& s) {
	if (!valid(s))  { return false; }
	if (sum_[0] < 0){ computeSum(s);}
	shared_->setOptimum(sum_);
	next_ = shared_->checkNext();
	gen_  = shared_->generation();
	upper_= shared_->upper(level_);
	POTASSCO_ASSERT(!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_], "Unexpected lower bound on model!");
	return true;
}